

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O1

void Js::AsmJsByteCodeDumper::DumpConstants(AsmJsFunc *func,FunctionBody *body)

{
  ulong uVar1;
  ulong uVar2;
  RegSlot RVar3;
  WriteBarrierPtr<void> *pWVar4;
  code *pcVar5;
  bool bVar6;
  undefined4 *puVar7;
  RegisterSpace *pRVar8;
  uint uVar9;
  TypedRegisterAllocator *this;
  ulong *puVar10;
  ulong uVar11;
  Types type;
  ulong uVar12;
  char16 local_e8 [4];
  char16 buf [32];
  TypedConstSourcesInfo constSrcInfos;
  undefined4 local_38;
  undefined4 uStack_34;
  
  pWVar4 = (body->m_constTable).ptr;
  this = &func->mTypedRegisterAllocator;
  WAsmJs::TypedRegisterAllocator::GetConstSourceInfos((TypedConstSourcesInfo *)(buf + 0x1c),this);
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  uVar12 = 0;
  do {
    type = (Types)uVar12;
    bVar6 = WAsmJs::TypedRegisterAllocator::IsTypeExcluded(this,type);
    if (!bVar6) {
      pRVar8 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this,type);
      RVar3 = pRVar8->mNbConst;
      if (RVar3 != 0) {
        if (type < LIMIT) {
          puVar10 = (ulong *)((long)&pWVar4->ptr + (ulong)constSrcInfos.srcByteOffsets[uVar12 - 2]);
          switch(uVar12 & 0xffffffff) {
          case 0:
            WAsmJs::RegisterSpace::GetTypeDebugName(type,local_e8,0x20,false);
            Output::Print(L"    Constant %s:\n    ======== =======\n    ",local_e8);
            WAsmJs::RegisterSpace::GetTypeDebugName(type,local_e8,0x20,true);
            uVar11 = 0;
            do {
              Output::Print(L" %s%d  ",local_e8,uVar11 & 0xffffffff);
              Output::Print(L"%d",(ulong)*(uint *)((long)puVar10 + uVar11 * 4));
              Output::Print(L"\n    ");
              uVar11 = uVar11 + 1;
            } while (RVar3 != (RegSlot)uVar11);
            break;
          case 1:
            WAsmJs::RegisterSpace::GetTypeDebugName(type,local_e8,0x20,false);
            Output::Print(L"    Constant %s:\n    ======== =======\n    ",local_e8);
            WAsmJs::RegisterSpace::GetTypeDebugName(type,local_e8,0x20,true);
            uVar11 = 0;
            do {
              Output::Print(L" %s%d  ",local_e8,uVar11 & 0xffffffff);
              Output::Print(L"%lld",puVar10[uVar11]);
              Output::Print(L"\n    ");
              uVar11 = uVar11 + 1;
            } while (RVar3 != (RegSlot)uVar11);
            break;
          case 2:
            WAsmJs::RegisterSpace::GetTypeDebugName(type,local_e8,0x20,false);
            Output::Print(L"    Constant %s:\n    ======== =======\n    ",local_e8);
            WAsmJs::RegisterSpace::GetTypeDebugName(type,local_e8,0x20,true);
            uVar11 = 0;
            do {
              Output::Print(L" %s%d  ",local_e8,uVar11 & 0xffffffff);
              Output::Print(L"%.4f",(double)*(float *)((long)puVar10 + uVar11 * 4));
              Output::Print(L"\n    ");
              uVar11 = uVar11 + 1;
            } while (RVar3 != (RegSlot)uVar11);
            break;
          case 3:
            WAsmJs::RegisterSpace::GetTypeDebugName(type,local_e8,0x20,false);
            Output::Print(L"    Constant %s:\n    ======== =======\n    ",local_e8);
            WAsmJs::RegisterSpace::GetTypeDebugName(type,local_e8,0x20,true);
            uVar11 = 0;
            do {
              Output::Print(L" %s%d  ",local_e8,uVar11 & 0xffffffff);
              Output::Print(L"%.4f",puVar10[uVar11]);
              Output::Print(L"\n    ");
              uVar11 = uVar11 + 1;
            } while (RVar3 != (RegSlot)uVar11);
            break;
          case 4:
            uVar11 = 0;
            WAsmJs::RegisterSpace::GetTypeDebugName(type,local_e8,0x20,false);
            Output::Print(L"    Constant %s:\n    ======== =======\n    ",local_e8);
            WAsmJs::RegisterSpace::GetTypeDebugName(type,local_e8,0x20,true);
            do {
              Output::Print(L" %s%d  ",local_e8,uVar11);
              uVar1 = *puVar10;
              uVar2 = puVar10[1];
              Output::Print(L"\n       I32(%d, %d, %d, %d),",uVar1 & 0xffffffff,uVar1 >> 0x20,
                            uVar2 & 0xffffffff,uVar2 >> 0x20);
              local_38 = (float)uVar2;
              uStack_34 = (float)(uVar2 >> 0x20);
              Output::Print(L"\n       F32(%.4f, %.4f, %.4f, %.4f),",(double)(float)uVar1,
                            (double)(float)(uVar1 >> 0x20),(double)local_38,(double)uStack_34);
              Output::Print(L"\n       D64(%.4f, %.4f),",uVar1,uVar2);
              local_38._0_1_ = (char)uVar2;
              local_38._1_1_ = (char)(uVar2 >> 8);
              local_38._2_1_ = (char)(uVar2 >> 0x10);
              local_38._3_1_ = (char)(uVar2 >> 0x18);
              uStack_34._0_1_ = (char)(uVar2 >> 0x20);
              uStack_34._1_1_ = (char)(uVar2 >> 0x28);
              uStack_34._2_1_ = (char)(uVar2 >> 0x30);
              uStack_34._3_1_ = (char)(uVar2 >> 0x38);
              Output::Print(L"\n       I8(%d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d)"
                            ,(ulong)(uint)(int)(char)uVar1,(ulong)(uint)(int)(char)(uVar1 >> 8),
                            (ulong)(uint)(int)(char)(uVar1 >> 0x10),
                            (ulong)(uint)((int)(float)uVar1 >> 0x18),
                            (ulong)(uint)((int)(uVar1 >> 8) >> 0x18),
                            (ulong)(uint)((int)(uVar1 >> 0x10) >> 0x18),
                            (ulong)(uint)((int)(uVar1 >> 0x18) >> 0x18),(long)uVar1 >> 0x38,
                            (ulong)(uint)(int)(char)local_38,(ulong)(uint)(int)local_38._1_1_,
                            (ulong)(uint)(int)local_38._2_1_,(ulong)(uint)(int)local_38._3_1_,
                            (ulong)(uint)(int)(char)uStack_34,(ulong)(uint)(int)uStack_34._1_1_,
                            (ulong)(uint)(int)uStack_34._2_1_,(ulong)(uint)(int)uStack_34._3_1_);
              Output::Print(L"\n    ");
              puVar10 = puVar10 + 2;
              uVar9 = (int)uVar11 + 1;
              uVar11 = (ulong)uVar9;
            } while (RVar3 != uVar9);
          }
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar7 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                      ,0xfd,"(false)","false");
          if (!bVar6) {
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar7 = 0;
        }
      }
      Output::Print(L"\n");
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 5);
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpConstants(AsmJsFunc* func, FunctionBody* body)
    {
        byte* table = (byte*)body->GetConstTable();
        auto constSrcInfos = func->GetTypedRegisterAllocator().GetConstSourceInfos();
        for (int i = 0; i < WAsmJs::LIMIT; ++i)
        {
            WAsmJs::Types type = (WAsmJs::Types)i;
            if (func->GetTypedRegisterAllocator().IsTypeExcluded(type))
            {
                continue;
            }
            uint constCount = func->GetTypedRegisterAllocator().GetRegisterSpace(type)->GetConstCount();
            if (constCount > 0)
            {
                uint offset = constSrcInfos.srcByteOffsets[i];
                byte* tableOffseted = table + offset;
                switch (type)
                {
                case WAsmJs::INT32:   PrintTypedConstants<int>(tableOffseted, type, constCount, [](int v) {Output::Print(_u("%d"), v);}); break;
                case WAsmJs::INT64:   PrintTypedConstants<int64>(tableOffseted, type, constCount, [](int64 v) {Output::Print(_u("%lld"), v);}); break;
                case WAsmJs::FLOAT32: PrintTypedConstants<float>(tableOffseted, type, constCount, [](float v) {Output::Print(_u("%.4f"), v);}); break;
                case WAsmJs::FLOAT64: PrintTypedConstants<double>(tableOffseted, type, constCount, [](double v) {Output::Print(_u("%.4f"), v);}); break;
                case WAsmJs::SIMD:    PrintTypedConstants<AsmJsSIMDValue>(tableOffseted, type, constCount, [](AsmJsSIMDValue v) {
                    Output::Print(_u("\n       I32(%d, %d, %d, %d),"), v.i32[SIMD_X], v.i32[SIMD_Y], v.i32[SIMD_Z], v.i32[SIMD_W]);
                    Output::Print(_u("\n       F32(%.4f, %.4f, %.4f, %.4f),"), v.f32[SIMD_X], v.f32[SIMD_Y], v.f32[SIMD_Z], v.f32[SIMD_W]);
                    Output::Print(_u("\n       D64(%.4f, %.4f),"), v.f64[SIMD_X], v.f64[SIMD_Y]);
                    Output::Print(_u("\n       I8(%d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d, %d)"),
                                  v.i8[0], v.i8[1], v.i8[2], v.i8[3], v.i8[4], v.i8[5], v.i8[6], v.i8[7],
                                  v.i8[8], v.i8[9], v.i8[10], v.i8[11], v.i8[12], v.i8[13], v.i8[14], v.i8[15]);
                    });
                    break;
                default:
                    Assert(false);
                    break;
                }
            }
            Output::Print(_u("\n"));
        }
    }